

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vecmath.h
# Opt level: O2

void __thiscall
pbrt::PiecewiseConstant2D::PiecewiseConstant2D(PiecewiseConstant2D *this,Allocator alloc)

{
  undefined1 auVar1 [16];
  
  (this->domain).pMin.super_Tuple2<pbrt::Point2,_float> =
       (Tuple2<pbrt::Point2,_float>)0x7f7fffff7f7fffff;
  (this->domain).pMax.super_Tuple2<pbrt::Point2,_float> =
       (Tuple2<pbrt::Point2,_float>)0xff7fffffff7fffff;
  auVar1 = ZEXT816(0) << 0x20;
  (this->pConditionalV).alloc.memoryResource = alloc.memoryResource;
  (this->pConditionalV).nStored = 0;
  (this->pConditionalV).ptr = (PiecewiseConstant1D *)auVar1._0_8_;
  (this->pConditionalV).nAlloc = auVar1._8_8_;
  (this->pMarginal).func.alloc.memoryResource = alloc.memoryResource;
  (this->pMarginal).func.ptr = (float *)auVar1._0_8_;
  (this->pMarginal).func.nAlloc = auVar1._8_8_;
  (this->pMarginal).func.nStored = 0;
  (this->pMarginal).cdf.alloc.memoryResource = alloc.memoryResource;
  (this->pMarginal).cdf.ptr = (float *)auVar1._0_8_;
  (this->pMarginal).cdf.nAlloc = auVar1._8_8_;
  (this->pMarginal).cdf.nStored = 0;
  (this->pMarginal).funcInt = 0.0;
  return;
}

Assistant:

PBRT_CPU_GPU
    Bounds2() {
        T minNum = std::numeric_limits<T>::lowest();
        T maxNum = std::numeric_limits<T>::max();
        pMin = Point2<T>(maxNum, maxNum);
        pMax = Point2<T>(minNum, minNum);
    }